

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O0

void __thiscall QScrollArea::ensureVisible(QScrollArea *this,int x,int y,int xmargin,int ymargin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QScrollAreaPrivate *pQVar4;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  long in_FS_OFFSET;
  int logicalX;
  QScrollAreaPrivate *d;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QRect *in_stack_ffffffffffffff48;
  LayoutDirection in_stack_ffffffffffffff54;
  QWidget *in_stack_ffffffffffffff58;
  QScrollBar *this_00;
  int local_48;
  int local_44;
  int local_40 [3];
  int local_34;
  int local_30 [4];
  QRect local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QScrollArea *)0x67a3c1);
  QWidget::layoutDirection((QWidget *)0x67a3d0);
  local_20 = QWidget::rect(in_stack_ffffffffffffff58);
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  local_10 = QStyle::visualPos(in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
                               (QPoint *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  iVar1 = QPoint::x((QPoint *)0x67a438);
  iVar2 = QAbstractSlider::value
                    ((QAbstractSlider *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (iVar1 - in_ECX < iVar2) {
    local_30[1] = 0;
    local_30[0] = iVar1 - in_ECX;
    qMax<int>(local_30 + 1,local_30);
    QAbstractSlider::setValue
              ((QAbstractSlider *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  }
  else {
    iVar2 = QAbstractSlider::value
                      ((QAbstractSlider *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    iVar3 = QWidget::width((QWidget *)0x67a4e2);
    if ((iVar2 + iVar3) - in_ECX < iVar1) {
      iVar2 = QWidget::width((QWidget *)0x67a520);
      local_34 = (iVar1 - iVar2) + in_ECX;
      local_40[2] = QAbstractSlider::maximum
                              ((QAbstractSlider *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      qMin<int>(&local_34,local_40 + 2);
      QAbstractSlider::setValue
                ((QAbstractSlider *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    }
  }
  iVar1 = QAbstractSlider::value
                    ((QAbstractSlider *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (in_EDX - in_R8D < iVar1) {
    this_00 = (pQVar4->super_QAbstractScrollAreaPrivate).vbar;
    local_40[1] = 0;
    local_40[0] = in_EDX - in_R8D;
    qMax<int>(local_40 + 1,local_40);
    QAbstractSlider::setValue(&this_00->super_QAbstractSlider,in_stack_ffffffffffffff54);
  }
  else {
    iVar1 = in_EDX;
    iVar2 = QAbstractSlider::value
                      ((QAbstractSlider *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    iVar3 = QWidget::height((QWidget *)0x67a614);
    if ((iVar2 + iVar3) - in_R8D < iVar1) {
      iVar2 = QWidget::height((QWidget *)0x67a652);
      local_44 = (in_EDX - iVar2) + in_R8D;
      local_48 = QAbstractSlider::maximum
                           ((QAbstractSlider *)CONCAT44(in_EDX,in_stack_ffffffffffffff40));
      qMin<int>(&local_44,&local_48);
      QAbstractSlider::setValue((QAbstractSlider *)in_stack_ffffffffffffff58,iVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollArea::ensureVisible(int x, int y, int xmargin, int ymargin)
{
    Q_D(QScrollArea);

    int logicalX = QStyle::visualPos(layoutDirection(), d->viewport->rect(), QPoint(x, y)).x();

    if (logicalX - xmargin < d->hbar->value()) {
        d->hbar->setValue(qMax(0, logicalX - xmargin));
    } else if (logicalX > d->hbar->value() + d->viewport->width() - xmargin) {
        d->hbar->setValue(qMin(logicalX - d->viewport->width() + xmargin, d->hbar->maximum()));
    }

    if (y - ymargin < d->vbar->value()) {
        d->vbar->setValue(qMax(0, y - ymargin));
    } else if (y > d->vbar->value() + d->viewport->height() - ymargin) {
        d->vbar->setValue(qMin(y - d->viewport->height() + ymargin, d->vbar->maximum()));
    }
}